

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrTsim.c
# Opt level: O2

void Pdr_ManExtendUndo(Aig_Man_t *pAig,Vec_Int_t *vUndo)

{
  int iVar1;
  int iVar2;
  Aig_Obj_t *pObj;
  int i;
  
  i = 0;
  while( true ) {
    if (vUndo->nSize <= i) {
      return;
    }
    iVar1 = Vec_IntEntry(vUndo,i);
    pObj = Aig_ManObj(pAig,iVar1);
    iVar1 = Vec_IntEntry(vUndo,i + 1);
    iVar2 = Pdr_ManSimInfoGet(pAig,pObj);
    if (iVar2 != 3) break;
    Pdr_ManSimInfoSet(pAig,pObj,iVar1);
    i = i + 2;
  }
  __assert_fail("Pdr_ManSimInfoGet(pAig, pObj) == PDR_UND",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrTsim.c"
                ,0x102,"void Pdr_ManExtendUndo(Aig_Man_t *, Vec_Int_t *)");
}

Assistant:

void Pdr_ManExtendUndo( Aig_Man_t * pAig, Vec_Int_t * vUndo )
{
    Aig_Obj_t * pObj;
    int i, Value;
    Aig_ManForEachObjVec( vUndo, pAig, pObj, i )
    {
        Value  = Vec_IntEntry(vUndo, ++i);
        assert( Pdr_ManSimInfoGet(pAig, pObj) == PDR_UND );
        Pdr_ManSimInfoSet( pAig, pObj, Value );
    }
}